

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.hpp
# Opt level: O0

void pstore::raise_exception<std::system_error,void>(system_error *exc)

{
  system_error *this;
  system_error *exc_local;
  
  this = (system_error *)__cxa_allocate_exception(0x20);
  std::system_error::system_error(this,exc);
  __cxa_throw(this,&std::system_error::typeinfo,std::system_error::~system_error);
}

Assistant:

PSTORE_NO_RETURN void raise_exception (Exception const & exc) {
#ifdef PSTORE_EXCEPTIONS
        throw exc;
#else
#    ifdef _WIN32
        std::wcerr << L"Error: " << utf::win32::to16 (exc.what ()) << L'\n';
#    else
        std::cerr << "Error: " << exc.what () << '\n';
#    endif // _WIN32
        std::exit (EXIT_FAILURE);
#endif     // PSTORE_EXCEPTIONS
    }